

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O1

void __thiscall AddressFilter::AddToList(AddressFilter *this,uint8_t *addr,size_t len)

{
  IPAsKey *key;
  size_t __n;
  bool stored;
  bool local_29;
  
  key = (IPAsKey *)operator_new(0x30);
  key->_vptr_IPAsKey = (_func_int **)&PTR__IPAsKeyLRU_001e0560;
  key->HashNext = (IPAsKey *)0x0;
  key->count = 1;
  key->hash = 0;
  __n = 0x10;
  if (len < 0x10) {
    __n = len;
  }
  memcpy(key->addr,addr,__n);
  key->addr_len = __n;
  local_29 = false;
  BinHash<IPAsKey>::InsertOrAdd(&this->table,key,false,&local_29);
  if (local_29 == false) {
    (*key->_vptr_IPAsKey[1])(key);
  }
  return;
}

Assistant:

void AddressFilter::AddToList(uint8_t * addr, size_t len)
{
    IPAsKey * x = new IPAsKey(addr, len);

    if (x != NULL)
    {
        bool stored = false;

        (void)table.InsertOrAdd(x, false, &stored);

        if (!stored)
        {
            delete x;
        }
    }
}